

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_enumerate_devices
              (cubeb *context,cubeb_device_type devtype,cubeb_device_collection *collection)

{
  long in_RDX;
  uint in_ESI;
  long *in_RDI;
  size_t i;
  int rv;
  cubeb_device_info *in_stack_00000130;
  undefined8 local_30;
  undefined4 local_4;
  
  if ((in_ESI & 3) == 0) {
    local_4 = -3;
  }
  else if (in_RDX == 0) {
    local_4 = -3;
  }
  else if (*(long *)(*in_RDI + 0x28) == 0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_ESI,in_RDX);
    if (g_cubeb_log_callback != (cubeb_log_callback)0x0) {
      for (local_30 = 0; local_30 < *(ulong *)(in_RDX + 8); local_30 = local_30 + 1) {
        log_device(in_stack_00000130);
      }
    }
  }
  return local_4;
}

Assistant:

int cubeb_enumerate_devices(cubeb * context,
                            cubeb_device_type devtype,
                            cubeb_device_collection * collection)
{
  int rv;
  if ((devtype & (CUBEB_DEVICE_TYPE_INPUT | CUBEB_DEVICE_TYPE_OUTPUT)) == 0)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (collection == NULL)
    return CUBEB_ERROR_INVALID_PARAMETER;
  if (!context->ops->enumerate_devices)
    return CUBEB_ERROR_NOT_SUPPORTED;

  rv = context->ops->enumerate_devices(context, devtype, collection);

  if (g_cubeb_log_callback) {
    for (size_t i = 0; i < collection->count; i++) {
      log_device(&collection->device[i]);
    }
  }

  return rv;
}